

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

int xmlTextReaderNextSibling(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  _xmlNode *p_Var2;
  int iVar3;
  xmlTextReaderState xVar4;
  
  iVar3 = -1;
  if (((reader == (xmlTextReaderPtr)0x0) || (reader->doc == (xmlDocPtr)0x0)) ||
     (iVar3 = 0, reader->state == XML_TEXTREADER_END)) {
    return iVar3;
  }
  if (reader->node != (xmlNodePtr)0x0) {
    p_Var2 = reader->node->next;
    if (p_Var2 == (_xmlNode *)0x0) {
      return 0;
    }
    reader->node = p_Var2;
    reader->state = XML_TEXTREADER_START;
    return 1;
  }
  if (reader->state == XML_TEXTREADER_END) {
    return 0;
  }
  pxVar1 = reader->node;
  if (pxVar1 == (xmlNodePtr)0x0) {
    p_Var2 = reader->doc->children;
    if (p_Var2 == (_xmlNode *)0x0) {
      iVar3 = 0;
      xVar4 = XML_TEXTREADER_END;
      goto LAB_001742c1;
    }
LAB_001742b5:
    reader->node = p_Var2;
  }
  else {
    if (reader->state != XML_TEXTREADER_BACKTRACK) {
      p_Var2 = pxVar1->next;
      if (p_Var2 != (_xmlNode *)0x0) goto LAB_001742b5;
      reader->state = XML_TEXTREADER_BACKTRACK;
      xmlTextReaderRead(reader);
      pxVar1 = reader->node;
    }
    if (pxVar1->next == (_xmlNode *)0x0) {
      p_Var2 = pxVar1->parent;
      iVar3 = 1;
      xVar4 = XML_TEXTREADER_END;
      if (p_Var2 != (_xmlNode *)0x0) {
        if (p_Var2->type == XML_DOCUMENT_NODE) {
          iVar3 = 0;
        }
        else {
          reader->node = p_Var2;
          reader->depth = reader->depth + -1;
          reader->state = XML_TEXTREADER_BACKTRACK;
          xmlTextReaderNextTree(reader);
        }
      }
      goto LAB_001742c1;
    }
    reader->node = pxVar1->next;
  }
  iVar3 = 1;
  xVar4 = XML_TEXTREADER_START;
LAB_001742c1:
  reader->state = xVar4;
  return iVar3;
}

Assistant:

int
xmlTextReaderNextSibling(xmlTextReaderPtr reader) {
    if (reader == NULL)
        return(-1);
    if (reader->doc == NULL) {
        /* TODO */
	return(-1);
    }

    if (reader->state == XML_TEXTREADER_END)
        return(0);

    if (reader->node == NULL)
        return(xmlTextReaderNextTree(reader));

    if (reader->node->next != NULL) {
        reader->node = reader->node->next;
        reader->state = XML_TEXTREADER_START;
        return(1);
    }

    return(0);
}